

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

string * GdlRule::GlyphMetricDebugString_abi_cxx11_(int gmet)

{
  undefined4 in_ESI;
  string *in_RDI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator *paVar1;
  char *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff88;
  string local_48 [33];
  allocator local_27;
  allocator local_26;
  allocator local_25;
  allocator local_24;
  allocator local_23;
  allocator local_22;
  allocator local_21;
  allocator local_20;
  allocator local_1f;
  allocator local_1e;
  allocator local_1d [16];
  allocator local_d [13];
  
  switch(in_ESI) {
  case 0:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"lsb",local_d);
    std::allocator<char>::~allocator((allocator<char> *)local_d);
    break;
  case 1:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"rsb",local_1d);
    std::allocator<char>::~allocator((allocator<char> *)local_1d);
    break;
  case 2:
    paVar1 = &local_1e;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_top",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    break;
  case 3:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_bottom",&local_1f);
    std::allocator<char>::~allocator((allocator<char> *)&local_1f);
    break;
  case 4:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_left",&local_20);
    std::allocator<char>::~allocator((allocator<char> *)&local_20);
    break;
  case 5:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_right",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
    break;
  case 6:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_height",&local_22);
    std::allocator<char>::~allocator((allocator<char> *)&local_22);
    break;
  case 7:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"bb_width",&local_23);
    std::allocator<char>::~allocator((allocator<char> *)&local_23);
    break;
  case 8:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"aw",&local_24);
    std::allocator<char>::~allocator((allocator<char> *)&local_24);
    break;
  case 9:
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"ah",&local_25);
    std::allocator<char>::~allocator((allocator<char> *)&local_25);
    break;
  case 10:
    paVar1 = &local_26;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"ascent",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case 0xb:
    paVar1 = &local_27;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(in_RDI,"descent",paVar1);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  default:
    std::__cxx11::to_string((int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
    std::operator+(in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    std::__cxx11::string::~string(local_48);
  }
  return in_RDI;
}

Assistant:

std::string GdlRule::GlyphMetricDebugString(int gmet)
{
	switch (gmet)
	{
	case kgmetLsb:				return "lsb";
	case kgmetRsb:				return "rsb";
	case kgmetBbTop:			return "bb_top";
	case kgmetBbBottom:			return "bb_bottom";
	case kgmetBbLeft:			return "bb_left";
	case kgmetBbRight:			return "bb_right";
	case kgmetBbHeight:			return "bb_height";
	case kgmetBbWidth:			return "bb_width";
	case kgmetAdvWidth:			return "aw";
	case kgmetAdvHeight:		return "ah";
	case kgmetAscent:			return "ascent";
	case kgmetDescent:			return "descent";
	default:
		Assert(false);
		return "bad-glyph-metric-" + std::to_string(gmet);
	}
}